

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O2

void duckdb_brotli::BrotliBuildAndStoreHuffmanTreeFast
               (HuffmanTree *tree,uint32_t *histogram,size_t histogram_total,size_t max_bits,
               uint8_t *depth,uint16_t *bits,size_t *storage_ix,uint8_t *storage)

{
  byte bVar1;
  uint uVar2;
  HuffmanTree HVar3;
  size_t sVar4;
  int iVar5;
  HuffmanTree *pHVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  byte bVar13;
  uint *puVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  HuffmanTree *pHVar18;
  HuffmanTree *pHVar19;
  int iVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  size_t symbols [4];
  
  symbols[2] = 0;
  symbols[3] = 0;
  symbols[0] = 0;
  symbols[1] = 0;
  uVar24 = 0;
  uVar22 = 0;
  while (histogram_total != 0) {
    uVar15 = histogram[uVar24];
    if ((ulong)uVar15 != 0) {
      if (uVar22 < 4) {
        symbols[uVar22] = uVar24;
      }
      uVar22 = uVar22 + 1;
      histogram_total = histogram_total - uVar15;
    }
    uVar24 = uVar24 + 1;
  }
  if (uVar22 < 2) {
    uVar24 = *storage_ix;
    uVar22 = uVar24 + 4;
    *(ulong *)(storage + (uVar24 >> 3)) = (ulong)storage[uVar24 >> 3] | 1L << ((byte)uVar24 & 7);
    *storage_ix = uVar22;
    *(size_t *)(storage + (uVar22 >> 3)) =
         symbols[0] << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
    *storage_ix = uVar24 + max_bits + 4;
    depth[symbols[0]] = '\0';
    bits[symbols[0]] = 0;
    return;
  }
  switchD_004a0b15::default(depth,0,uVar24);
  uVar15 = 1;
  pHVar6 = tree;
  uVar7 = uVar24;
LAB_00e21fb2:
  do {
    puVar14 = histogram + (uVar7 - 1);
    uVar9 = 0;
    while (uVar7 != uVar9) {
      uVar10 = *puVar14;
      uVar9 = uVar9 + 1;
      puVar14 = puVar14 + -1;
      if (uVar10 != 0) goto code_r0x00e21fca;
    }
    uVar7 = (ulong)((long)pHVar6 - (long)tree) >> 3;
    iVar5 = (int)uVar7;
    uVar9 = (ulong)iVar5;
    if (uVar9 < 0xd) {
      for (uVar12 = 1; uVar12 < uVar9; uVar12 = uVar12 + 1) {
        HVar3 = tree[uVar12];
        uVar17 = uVar12;
        do {
          if (tree[uVar17 - 1].total_count_ <= HVar3.total_count_) goto LAB_00e2203a;
          tree[uVar17] = tree[uVar17 - 1];
          uVar17 = uVar17 - 1;
        } while (uVar17 != 0);
        uVar17 = 0;
LAB_00e2203a:
        tree[uVar17] = HVar3;
      }
    }
    else {
      for (uVar12 = (ulong)((uint)(uVar9 < 0x39) * 2); uVar12 != 6; uVar12 = uVar12 + 1) {
        uVar17 = *(ulong *)(kBrotliShellGaps + uVar12 * 8);
        pHVar18 = tree + uVar17;
        pHVar19 = tree;
        for (uVar21 = uVar17; uVar21 < uVar9; uVar21 = uVar21 + 1) {
          HVar3 = tree[uVar21];
          for (lVar23 = 0;
              (uVar17 <= uVar21 + lVar23 && (HVar3.total_count_ < pHVar19[lVar23].total_count_));
              lVar23 = lVar23 - uVar17) {
            pHVar18[lVar23] = pHVar19[lVar23];
          }
          pHVar18[lVar23] = HVar3;
          pHVar18 = pHVar18 + 1;
          pHVar19 = pHVar19 + 1;
        }
      }
    }
    iVar8 = iVar5 + 1;
    pHVar6->total_count_ = 0xffffffff;
    pHVar6->index_left_ = -1;
    pHVar6->index_right_or_value_ = -1;
    pHVar6[1].total_count_ = 0xffffffff;
    pHVar6[1].index_left_ = -1;
    pHVar6[1].index_right_or_value_ = -1;
    pHVar6 = pHVar6 + 2;
    iVar11 = 0;
    for (uVar7 = uVar7 & 0xffffffff; 1 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 1)) {
      uVar2 = tree[iVar11].total_count_;
      uVar10 = tree[iVar8].total_count_;
      iVar16 = iVar11;
      if (uVar10 < uVar2) {
        iVar16 = iVar8;
      }
      iVar11 = iVar11 + (uint)(uVar2 <= uVar10);
      iVar8 = iVar8 + (uint)(uVar10 < uVar2);
      uVar2 = tree[iVar11].total_count_;
      uVar10 = tree[iVar8].total_count_;
      iVar20 = iVar11;
      if (uVar10 < uVar2) {
        iVar20 = iVar8;
      }
      iVar11 = iVar11 + (uint)(uVar2 <= uVar10);
      iVar8 = iVar8 + (uint)(uVar10 < uVar2);
      pHVar6[-1].total_count_ = tree[iVar20].total_count_ + tree[iVar16].total_count_;
      pHVar6[-1].index_left_ = (int16_t)iVar16;
      pHVar6[-1].index_right_or_value_ = (int16_t)iVar20;
      pHVar6->total_count_ = 0xffffffff;
      pHVar6->index_left_ = -1;
      pHVar6->index_right_or_value_ = -1;
      pHVar6 = pHVar6 + 1;
    }
    iVar5 = BrotliSetDepth(iVar5 * 2 + -1,tree,depth,0xe);
    uVar15 = uVar15 * 2;
    pHVar6 = tree;
    uVar7 = uVar24;
  } while (iVar5 == 0);
  BrotliConvertBitDepthsToSymbols(depth,uVar24,bits);
  if (uVar22 < 5) {
    uVar7 = *storage_ix;
    *(ulong *)(storage + (uVar7 >> 3)) = (ulong)storage[uVar7 >> 3] | 1L << ((byte)uVar7 & 7);
    uVar24 = uVar7 + 2;
    *storage_ix = uVar24;
    *(ulong *)(storage + (uVar24 >> 3)) =
         uVar22 - 1 << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
    uVar7 = uVar7 + 4;
    *storage_ix = uVar7;
    uVar24 = 0;
    while (uVar9 = uVar24, uVar9 != uVar22) {
      for (uVar12 = uVar9 + 1; uVar24 = uVar9 + 1, uVar12 < uVar22; uVar12 = uVar12 + 1) {
        sVar4 = symbols[uVar12];
        if (depth[sVar4] < depth[symbols[uVar9]]) {
          symbols[uVar12] = symbols[uVar9];
          symbols[uVar9] = sVar4;
        }
      }
    }
    uVar17 = symbols[0] << ((byte)uVar7 & 7);
    uVar12 = uVar7 >> 3;
    uVar7 = uVar7 + max_bits;
    uVar9 = uVar7 >> 3;
    bVar13 = (byte)uVar7;
    uVar24 = uVar7 + max_bits;
    if (uVar22 != 3) {
      if (uVar22 == 2) {
        *(ulong *)(storage + uVar12) = uVar17 | storage[uVar12];
        *storage_ix = uVar7;
        *(size_t *)(storage + uVar9) = symbols[1] << (bVar13 & 7) | (ulong)storage[uVar9];
      }
      else {
        *(ulong *)(storage + uVar12) = uVar17 | storage[uVar12];
        *storage_ix = uVar7;
        *(size_t *)(storage + uVar9) = symbols[1] << (bVar13 & 7) | (ulong)storage[uVar9];
        *storage_ix = uVar24;
        *(size_t *)(storage + (uVar24 >> 3)) =
             symbols[2] << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
        uVar24 = uVar24 + max_bits;
        *storage_ix = uVar24;
        *(size_t *)(storage + (uVar24 >> 3)) =
             symbols[3] << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
        uVar22 = uVar24 + max_bits;
        *storage_ix = uVar22;
        *(ulong *)(storage + (uVar22 >> 3)) =
             (ulong)(depth[symbols[0]] == '\x01') << ((byte)uVar22 & 7) |
             (ulong)storage[uVar22 >> 3];
        uVar24 = uVar24 + max_bits + 1;
      }
      *storage_ix = uVar24;
      return;
    }
    *(ulong *)(storage + uVar12) = uVar17 | storage[uVar12];
    *storage_ix = uVar7;
    *(size_t *)(storage + uVar9) = symbols[1] << (bVar13 & 7) | (ulong)storage[uVar9];
    *storage_ix = uVar24;
    *(size_t *)(storage + (uVar24 >> 3)) =
         symbols[2] << ((byte)uVar24 & 7) | (ulong)storage[uVar24 >> 3];
    *storage_ix = max_bits + uVar24;
    return;
  }
  uVar22 = *storage_ix;
  *(ulong *)(storage + (uVar22 >> 3)) =
       0xff55555554 << ((byte)uVar22 & 7) | (ulong)storage[uVar22 >> 3];
  uVar22 = uVar22 + 0x28;
  uVar7 = 0;
  bVar13 = 8;
LAB_00e2228e:
  do {
    *storage_ix = uVar22;
    while( true ) {
      if (uVar24 <= uVar7) {
        return;
      }
      bVar1 = depth[uVar7];
      uVar12 = (ulong)bVar1;
      for (uVar9 = 1;
          (uVar17 = uVar24 - uVar7, uVar7 + uVar9 < uVar24 &&
          (uVar17 = uVar9, depth[uVar9 + uVar7] == bVar1)); uVar9 = uVar9 + 1) {
      }
      uVar7 = uVar7 + uVar17;
      if (bVar1 == 0) {
        uVar15 = *(uint *)(kZeroRepsDepth + uVar17 * 4);
        *(ulong *)(storage + (uVar22 >> 3)) =
             *(long *)(kZeroRepsBits + uVar17 * 8) << ((byte)uVar22 & 7) |
             (ulong)storage[uVar22 >> 3];
        uVar22 = uVar22 + uVar15;
        goto LAB_00e2228e;
      }
      if (bVar13 != bVar1) {
        bVar13 = kCodeLengthDepth[uVar12];
        *(ulong *)(storage + (uVar22 >> 3)) =
             (ulong)*(uint *)(kCodeLengthBits + uVar12 * 4) << ((byte)uVar22 & 7) |
             (ulong)storage[uVar22 >> 3];
        uVar22 = uVar22 + bVar13;
        *storage_ix = uVar22;
        uVar17 = uVar17 - 1;
      }
      bVar13 = bVar1;
      if (2 < uVar17) break;
      while (bVar25 = uVar17 != 0, uVar17 = uVar17 - 1, bVar25) {
        bVar1 = kCodeLengthDepth[uVar12];
        *(ulong *)(storage + (uVar22 >> 3)) =
             (ulong)*(uint *)(kCodeLengthBits + uVar12 * 4) << ((byte)uVar22 & 7) |
             (ulong)storage[uVar22 >> 3];
        uVar22 = uVar22 + bVar1;
        *storage_ix = uVar22;
      }
    }
    uVar15 = *(uint *)(kCodeLengthBits + uVar17 * 4 + 0x44);
    *(ulong *)(storage + (uVar22 >> 3)) =
         *(long *)(kNonZeroRepsDepth + uVar17 * 8 + 0xae8) << ((byte)uVar22 & 7) |
         (ulong)storage[uVar22 >> 3];
    uVar22 = uVar22 + uVar15;
  } while( true );
code_r0x00e21fca:
  if (uVar10 < uVar15) {
    uVar10 = uVar15;
  }
  pHVar6->total_count_ = uVar10;
  pHVar6->index_left_ = -1;
  pHVar6->index_right_or_value_ = (short)uVar7 - (short)uVar9;
  pHVar6 = pHVar6 + 1;
  uVar7 = uVar7 - uVar9;
  goto LAB_00e21fb2;
}

Assistant:

void duckdb_brotli::BrotliBuildAndStoreHuffmanTreeFast(HuffmanTree* tree,
                                        const uint32_t* histogram,
                                        const size_t histogram_total,
                                        const size_t max_bits,
                                        uint8_t* depth, uint16_t* bits,
                                        size_t* storage_ix,
                                        uint8_t* storage) {
  size_t count = 0;
  size_t symbols[4] = { 0 };
  size_t length = 0;
  size_t total = histogram_total;
  while (total != 0) {
    if (histogram[length]) {
      if (count < 4) {
        symbols[count] = length;
      }
      ++count;
      total -= histogram[length];
    }
    ++length;
  }

  if (count <= 1) {
    BrotliWriteBits(4, 1, storage_ix, storage);
    BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
    depth[symbols[0]] = 0;
    bits[symbols[0]] = 0;
    return;
  }

  memset(depth, 0, length * sizeof(depth[0]));
  {
    uint32_t count_limit;
    for (count_limit = 1; ; count_limit *= 2) {
      HuffmanTree* node = tree;
      size_t l;
      for (l = length; l != 0;) {
        --l;
        if (histogram[l]) {
          if (BROTLI_PREDICT_TRUE(histogram[l] >= count_limit)) {
            InitHuffmanTree(node, histogram[l], -1, (int16_t)l);
          } else {
            InitHuffmanTree(node, count_limit, -1, (int16_t)l);
          }
          ++node;
        }
      }
      {
        const int n = (int)(node - tree);
        HuffmanTree sentinel;
        int i = 0;      /* Points to the next leaf node. */
        int j = n + 1;  /* Points to the next non-leaf node. */
        int k;

        SortHuffmanTreeItems(tree, (size_t)n, SortHuffmanTree);
        /* The nodes are:
           [0, n): the sorted leaf nodes that we start with.
           [n]: we add a sentinel here.
           [n + 1, 2n): new parent nodes are added here, starting from
                        (n+1). These are naturally in ascending order.
           [2n]: we add a sentinel at the end as well.
           There will be (2n+1) elements at the end. */
        InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
        *node++ = sentinel;
        *node++ = sentinel;

        for (k = n - 1; k > 0; --k) {
          int left, right;
          if (tree[i].total_count_ <= tree[j].total_count_) {
            left = i;
            ++i;
          } else {
            left = j;
            ++j;
          }
          if (tree[i].total_count_ <= tree[j].total_count_) {
            right = i;
            ++i;
          } else {
            right = j;
            ++j;
          }
          /* The sentinel node becomes the parent node. */
          node[-1].total_count_ =
              tree[left].total_count_ + tree[right].total_count_;
          node[-1].index_left_ = (int16_t)left;
          node[-1].index_right_or_value_ = (int16_t)right;
          /* Add back the last sentinel node. */
          *node++ = sentinel;
        }
        if (BrotliSetDepth(2 * n - 1, tree, depth, 14)) {
          /* We need to pack the Huffman tree in 14 bits. If this was not
             successful, add fake entities to the lowest values and retry. */
          break;
        }
      }
    }
  }
  BrotliConvertBitDepthsToSymbols(depth, length, bits);
  if (count <= 4) {
    size_t i;
    /* value of 1 indicates a simple Huffman code */
    BrotliWriteBits(2, 1, storage_ix, storage);
    BrotliWriteBits(2, count - 1, storage_ix, storage);  /* NSYM - 1 */

    /* Sort */
    for (i = 0; i < count; i++) {
      size_t j;
      for (j = i + 1; j < count; j++) {
        if (depth[symbols[j]] < depth[symbols[i]]) {
          BROTLI_SWAP(size_t, symbols, j, i);
        }
      }
    }

    if (count == 2) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
    } else if (count == 3) {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
    } else {
      BrotliWriteBits(max_bits, symbols[0], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[1], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[2], storage_ix, storage);
      BrotliWriteBits(max_bits, symbols[3], storage_ix, storage);
      /* tree-select */
      BrotliWriteBits(1, depth[symbols[0]] == 1 ? 1 : 0, storage_ix, storage);
    }
  } else {
    uint8_t previous_value = 8;
    size_t i;
    /* Complex Huffman Tree */
    StoreStaticCodeLengthCode(storage_ix, storage);

    /* Actual RLE coding. */
    for (i = 0; i < length;) {
      const uint8_t value = depth[i];
      size_t reps = 1;
      size_t k;
      for (k = i + 1; k < length && depth[k] == value; ++k) {
        ++reps;
      }
      i += reps;
      if (value == 0) {
        BrotliWriteBits(kZeroRepsDepth[reps], kZeroRepsBits[reps],
                        storage_ix, storage);
      } else {
        if (previous_value != value) {
          BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                          storage_ix, storage);
          --reps;
        }
        if (reps < 3) {
          while (reps != 0) {
            reps--;
            BrotliWriteBits(kCodeLengthDepth[value], kCodeLengthBits[value],
                            storage_ix, storage);
          }
        } else {
          reps -= 3;
          BrotliWriteBits(kNonZeroRepsDepth[reps], kNonZeroRepsBits[reps],
                          storage_ix, storage);
        }
        previous_value = value;
      }
    }
  }
}